

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildObjectAPIConstructorBodyVectors
          (SwiftGenerator *this,FieldDef *field,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *buffer_constructor,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *base_constructor,string *indentation)

{
  bool bVar1;
  allocator<char> local_469;
  value_type local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [8];
  string default_value;
  string local_320;
  byte local_2fa;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  allocator<char> local_189;
  string local_188;
  string local_168;
  allocator<char> local_141;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_90 [8];
  string field_field;
  string field_var;
  Type vectortype;
  string *indentation_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *base_constructor_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *buffer_constructor_local;
  FieldDef *field_local;
  SwiftGenerator *this_local;
  
  Type::VectorType((Type *)((long)&field_var.field_2 + 8),&(field->value).type);
  IdlNamer::Field_abi_cxx11_((string *)((long)&field_field.field_2 + 8),&this->namer_,field);
  IdlNamer::Field_abi_cxx11_((string *)local_90,&this->namer_,field);
  if (field_var.field_2._8_4_ != 1) {
    std::operator+(&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_field.field_2 + 8)," = []");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(buffer_constructor,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::operator+(&local_100,"for index in 0..<_t.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    std::operator+(&local_e0,&local_100,"Count {");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(buffer_constructor,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::operator+(&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&field_field.field_2 + 8)," = []");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(base_constructor,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
  }
  switch(field_var.field_2._8_4_) {
  case 1:
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"VALUETYPE",&local_2d1);
    bVar1 = IsString((Type *)((long)&field_var.field_2 + 8));
    local_2fa = 0;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_2fa = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"String?",&local_2f9);
    }
    else {
      GenType_abi_cxx11_(&local_2f8,this,(Type *)((long)&field_var.field_2 + 8),false);
    }
    CodeWriter::SetValue(&this->code_,&local_2d0,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    if ((local_2fa & 1) != 0) {
      std::allocator<char>::~allocator(&local_2f9);
    }
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}]",
               (allocator<char> *)(default_value.field_2._M_local_buf + 0xf));
    CodeWriter::operator+=(&this->code_,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator((allocator<char> *)(default_value.field_2._M_local_buf + 0xf));
    bVar1 = IsEnum((Type *)((long)&field_var.field_2 + 8));
    if ((bVar1) && (field_var.field_2._8_4_ != 0x10)) {
      bVar1 = IsEnum(&(field->value).type);
      if (bVar1) {
        GenEnumDefaultValue_abi_cxx11_((string *)local_348,this,field);
      }
      else {
        SwiftConstant_abi_cxx11_((string *)local_348,this,field);
      }
      std::operator+(&local_3c8,indentation,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_field.field_2 + 8));
      std::operator+(&local_3a8,&local_3c8,".append(_t.");
      std::operator+(&local_388,&local_3a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      std::operator+(&local_368,&local_388,"(at: index)!)");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(buffer_constructor,&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)local_348);
    }
    else {
      std::operator+(&local_448,indentation,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_field.field_2 + 8));
      std::operator+(&local_428,&local_448,".append(_t.");
      std::operator+(&local_408,&local_428,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      std::operator+(&local_3e8,&local_408,"(at: index))");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(buffer_constructor,&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_448);
    }
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"VALUETYPE",&local_141);
    GenType_abi_cxx11_(&local_168,this,(Type *)((long)&field_var.field_2 + 8),true);
    CodeWriter::SetValue(&this->code_,&local_140,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}?]",&local_189)
    ;
    CodeWriter::operator+=(&this->code_,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    if ((*(byte *)(vectortype._0_8_ + 0x110) & 1) == 0) {
      std::operator+(&local_1f0,indentation,"var __v_ = _t.");
      std::operator+(&local_1d0,&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      std::operator+(&local_1b0,&local_1d0,"(at: index)");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(buffer_constructor,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::operator+(&local_230,indentation,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_field.field_2 + 8));
      std::operator+(&local_210,&local_230,".append(__v_?.unpack())");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(buffer_constructor,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
    }
    else {
      std::operator+(&local_2b0,indentation,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_field.field_2 + 8));
      std::operator+(&local_290,&local_2b0,".append(_t.");
      std::operator+(&local_270,&local_290,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_field.field_2 + 8));
      std::operator+(&local_250,&local_270,"(at: index))");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(buffer_constructor,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    break;
  case 0x10:
    BuildUnionEnumSwitchCase
              (this,(field->value).type.enum_def,(string *)((long)&field_field.field_2 + 8),
               buffer_constructor,indentation,true);
    break;
  case 0x11:
  case 0xe:
  }
  if (field_var.field_2._8_4_ != 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"}",&local_469);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(buffer_constructor,&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
  }
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(field_field.field_2._M_local_buf + 8));
  return;
}

Assistant:

void BuildObjectAPIConstructorBodyVectors(
      const FieldDef &field, std::vector<std::string> &buffer_constructor,
      std::vector<std::string> &base_constructor,
      const std::string &indentation) {
    const auto vectortype = field.value.type.VectorType();
    const auto field_var = namer_.Field(field);
    const auto field_field = namer_.Field(field);

    if (vectortype.base_type != BASE_TYPE_UTYPE) {
      buffer_constructor.push_back(field_var + " = []");
      buffer_constructor.push_back("for index in 0..<_t." + field_field +
                                   "Count {");
      base_constructor.push_back(field_var + " = []");
    }

    switch (vectortype.base_type) {
      case BASE_TYPE_STRUCT: {
        code_.SetValue("VALUETYPE", GenType(vectortype, true));
        code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}?]";
        if (!vectortype.struct_def->fixed) {
          buffer_constructor.push_back(indentation + "var __v_ = _t." +
                                       field_field + "(at: index)");
          buffer_constructor.push_back(indentation + field_var +
                                       ".append(__v_?.unpack())");
        } else {
          buffer_constructor.push_back(indentation + field_var + ".append(_t." +
                                       field_var + "(at: index))");
        }
        break;
      }
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();
      case BASE_TYPE_VECTOR: {
        break;
      }
      case BASE_TYPE_UNION: {
        BuildUnionEnumSwitchCase(*field.value.type.enum_def, field_var,
                                 buffer_constructor, indentation, true);
        break;
      }
      case BASE_TYPE_UTYPE: break;
      default: {
        code_.SetValue(
            "VALUETYPE",
            (IsString(vectortype) ? "String?" : GenType(vectortype)));
        code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}]";

        if (IsEnum(vectortype) && vectortype.base_type != BASE_TYPE_UNION) {
          const auto default_value = IsEnum(field.value.type)
                                         ? GenEnumDefaultValue(field)
                                         : SwiftConstant(field);
          buffer_constructor.push_back(indentation + field_var + ".append(_t." +
                                       field_field + "(at: index)!)");
          break;
        }
        buffer_constructor.push_back(indentation + field_var + ".append(_t." +
                                     field_field + "(at: index))");
        break;
      }
    }
    if (vectortype.base_type != BASE_TYPE_UTYPE)
      buffer_constructor.push_back("}");
  }